

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flvtag_initamf(flvtag_t *tag,uint32_t dts)

{
  uint8_t *puVar1;
  
  puVar1 = (uint8_t *)malloc(0x80f);
  tag->data = puVar1;
  tag->aloc = 0x80f;
  puVar1[4] = (uint8_t)(dts >> 0x10);
  puVar1[5] = (uint8_t)(dts >> 8);
  puVar1[6] = (uint8_t)dts;
  puVar1[7] = (uint8_t)(dts >> 0x18);
  puVar1[0] = '\x12';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xe] = '\v';
  return 1;
}

Assistant:

int flvtag_initamf(flvtag_t* tag, uint32_t dts)
{
    flvtag_init(tag);
    flvtag_reserve(tag, FLVTAG_PREALOC);
    tag->data[0] = flvtag_type_scriptdata;
    tag->data[4] = dts >> 16;
    tag->data[5] = dts >> 8;
    tag->data[6] = dts >> 0;
    tag->data[7] = dts >> 24;
    tag->data[8] = 0; // StreamID
    tag->data[9] = 0; // StreamID
    tag->data[10] = 0; // StreamID
    flvtag_updatesize(tag, 0);
    return 1;
}